

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int64_t __thiscall
icu_63::CollationDataBuilder::getSingleCE
          (CollationDataBuilder *this,UChar32 c,UErrorCode *errorCode)

{
  uint32_t uVar1;
  uint uVar2;
  uint *puVar3;
  uint32_t *puVar4;
  int64_t *piVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar1 = utrie2_get32_63(this->trie,c);
  uVar2 = uVar1;
  if (uVar1 == 0xc0) {
    uVar2 = CollationData::getCE32(this->base,c);
  }
joined_r0x00231de1:
  if ((~uVar2 & 0xc0) != 0) {
    return (ulong)((uVar2 & 0xff) << 8) | CONCAT44(uVar2,uVar2 << 0x10) & 0xffff0000ff000000;
  }
  switch(uVar2 & 0xf) {
  case 0:
  case 3:
    *errorCode = U_INTERNAL_PROGRAM_ERROR;
    return 0;
  case 1:
    uVar2 = uVar2 & 0xffffff00;
    goto LAB_00231ebb;
  case 2:
    return (ulong)(uVar2 & 0xffffff00);
  default:
    goto switchD_00231dff_caseD_4;
  case 5:
    if ((uVar2 & 0x1f00) != 0x100) goto switchD_00231dff_caseD_4;
    if (uVar1 != 0xc0) goto LAB_00231e52;
    puVar4 = this->base->ce32s;
    break;
  case 6:
    if ((uVar2 & 0x1f00) == 0x100) {
      if (uVar1 == 0xc0) {
        piVar5 = this->base->ces;
      }
      else {
        if ((this->ce64s).count <= (int)(uVar2 >> 0xd)) {
          return 0;
        }
        piVar5 = (this->ce64s).elements;
      }
      return piVar5[uVar2 >> 0xd];
    }
    goto switchD_00231dff_caseD_4;
  case 10:
LAB_00231e52:
    if ((this->ce32s).count <= (int)(uVar2 >> 0xd)) {
LAB_00231e70:
      uVar2 = 0;
      goto joined_r0x00231de1;
    }
    puVar4 = (uint32_t *)(this->ce32s).elements;
    break;
  case 0xb:
    if (uVar1 == 0xc0) {
      puVar3 = this->base->ce32s;
    }
    else {
      if ((this->ce32s).count < 1) goto LAB_00231e70;
      puVar3 = (uint *)(this->ce32s).elements;
    }
    uVar2 = *puVar3;
    goto joined_r0x00231de1;
  case 0xe:
    goto switchD_00231dff_caseD_e;
  case 0xf:
    uVar2 = Collation::unassignedPrimaryFromCodePoint(c);
LAB_00231ebb:
    return (ulong)uVar2 << 0x20 | 0x5000500;
  }
  uVar2 = puVar4[uVar2 >> 0xd];
  goto joined_r0x00231de1;
switchD_00231dff_caseD_e:
  uVar2 = getCE32FromOffsetCE32(this,uVar1 == 0xc0,c,uVar2);
  goto joined_r0x00231de1;
switchD_00231dff_caseD_4:
  *errorCode = U_UNSUPPORTED_ERROR;
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }